

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O1

bool absl::debugging_internal::Demangle(char *mangled,char *out,size_t out_size)

{
  char *str;
  long lVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  State state;
  State local_30;
  
  if ((*mangled == '_') && (mangled[1] == 'R')) {
    bVar2 = DemangleRustSymbolEncoding(mangled,out,out_size);
    return bVar2;
  }
  local_30.out_end_idx = (int)out_size;
  local_30.parse_state.mangled_idx = 0;
  local_30.parse_state.out_cur_idx = 0;
  local_30.parse_state.prev_name_idx = 0;
  local_30.parse_state._12_4_ = 0xffff0000;
  local_30.recursion_depth = 1;
  local_30.steps = 1;
  local_30.mangled_begin = mangled;
  local_30.out = out;
  bVar2 = ParseMangledName(&local_30);
  if (bVar2) {
    lVar3 = (long)local_30.parse_state.mangled_idx;
    if (local_30.mangled_begin[lVar3] != '\0') {
      str = local_30.mangled_begin + lVar3;
      lVar4 = 0;
      do {
        if (str[lVar4] == '.') {
          if ((str[lVar4 + 1] != 0x5f) && (0x19 < (byte)((str[lVar4 + 1] & 0xdfU) + 0xbf)))
          goto LAB_002764e7;
          lVar4 = lVar4 + 1;
          do {
            do {
              lVar1 = lVar4 + lVar3 + 1;
              lVar4 = lVar4 + 1;
            } while (local_30.mangled_begin[lVar1] == 0x5f);
          } while ((byte)((local_30.mangled_begin[lVar1] & 0xdfU) + 0xbf) < 0x1a);
          bVar2 = true;
        }
        else {
          if (str[lVar4] == '\0') goto LAB_0027654d;
LAB_002764e7:
          bVar2 = false;
        }
        if ((str[lVar4] == '.') && ((byte)(str[lVar4 + 1] - 0x30U) < 10)) {
          lVar4 = lVar4 + 1;
          do {
            lVar1 = lVar4 + lVar3 + 1;
            lVar4 = lVar4 + 1;
          } while ((byte)(local_30.mangled_begin[lVar1] - 0x30U) < 10);
          bVar2 = true;
        }
      } while (bVar2);
      if (local_30.mangled_begin[lVar3] != '@') goto LAB_00276565;
      MaybeAppend(&local_30,str);
    }
LAB_0027654d:
    bVar2 = 0 < local_30.parse_state.out_cur_idx &&
            local_30.parse_state.out_cur_idx < local_30.out_end_idx;
  }
  else {
LAB_00276565:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool Demangle(const char* mangled, char* out, size_t out_size) {
  if (mangled[0] == '_' && mangled[1] == 'R') {
    return DemangleRustSymbolEncoding(mangled, out, out_size);
  }

  State state;
  InitState(&state, mangled, out, out_size);
  return ParseTopLevelMangledName(&state) && !Overflowed(&state) &&
         state.parse_state.out_cur_idx > 0;
}